

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_component.cpp
# Opt level: O0

pin_container_t * __thiscall
lsim::SimComponent::output_pins(pin_container_t *__return_storage_ptr__,SimComponent *this)

{
  allocator<unsigned_int> local_39;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_38;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_28;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_20;
  SimComponent *local_18;
  SimComponent *this_local;
  
  local_18 = this;
  this_local = (SimComponent *)__return_storage_ptr__;
  local_28._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->m_pins);
  local_20 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator+(&local_28,(ulong)this->m_output_start);
  local_38._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->m_pins);
  local_30 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator+(&local_38,(ulong)this->m_control_start);
  std::allocator<unsigned_int>::allocator(&local_39);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,local_20,
             local_30,&local_39);
  std::allocator<unsigned_int>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

pin_container_t SimComponent::output_pins() const {
	return pin_container_t(m_pins.begin() + m_output_start, m_pins.begin() + m_control_start);
}